

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

void INT_CMpoll_network(CManager_conflict cm)

{
  CMControlList cl;
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  timespec ts;
  
  cl = cm->control_list;
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(cm,CMLowLevelVerbose);
    if (iVar1 == 0) goto LAB_00117368;
  }
  else if (CMtrace_val[3] == 0) goto LAB_00117368;
  if (CMtrace_PID != 0) {
    __stream = (FILE *)cm->CMTrace_file;
    _Var2 = getpid();
    pVar3 = pthread_self();
    fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,(timespec *)&ts);
    fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
  }
  fwrite("CM Poll Network\n",0x10,1,(FILE *)cm->CMTrace_file);
LAB_00117368:
  fflush((FILE *)cm->CMTrace_file);
  (*(cl->network_polling_function).func)
            ((CManager)&CMstatic_trans_svcs,(cl->network_polling_function).client_data);
  CMcontrol_list_poll(cl);
  return;
}

Assistant:

extern void
INT_CMpoll_network(CManager cm)
{
    CMControlList cl = cm->control_list;
    CMtrace_out(cm, CMLowLevelVerbose, "CM Poll Network\n");
    cl->network_polling_function.func((void*)&CMstatic_trans_svcs,
				      cl->network_polling_function.client_data);
    CMcontrol_list_poll(cl);
}